

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iprog.c
# Opt level: O2

void pulse_prog_steal(OBJ_DATA *obj,bool isTick)

{
  CHAR_DATA *ch;
  CHAR_DATA *ch_00;
  OBJ_DATA *obj_00;
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  CHAR_DATA **ppCVar5;
  OBJ_DATA **ppOVar6;
  
  ch = obj->carried_by;
  iVar2 = number_range(0,5);
  if (ch != (CHAR_DATA *)0x0) {
    bVar1 = is_worn(obj);
    if ((bVar1) && (ch->position == 8)) {
      iVar4 = 0;
      ppCVar5 = &ch->in_room->people;
      while (ch_00 = *ppCVar5, ch_00 != (CHAR_DATA *)0x0) {
        iVar3 = number_percent();
        if ((0x61 < iVar3) && (ch_00 != ch)) {
          ppOVar6 = &ch_00->carrying;
          while (obj_00 = *ppOVar6, obj_00 != (OBJ_DATA *)0x0) {
            if (obj_00->wear_loc == -1) {
              bVar1 = can_see_obj(ch,obj_00);
              if ((bVar1) && ((iVar2 == iVar4 || (obj_00->next_content == (OBJ_DATA *)0x0)))) {
                send_to_char("You grin evilly as a sudden urge takes hold of you.\n\r",ch);
                act("Slipping into $N\'s pockets, you carefully slide $p out.",ch,obj_00,ch_00,3);
                iVar2 = number_percent();
                if ((0x5f < iVar2) && (ch_00->position != 4)) {
                  do_myell(ch_00,"Keep your hands out of there!",ch);
                  send_to_char("Oops.\n\r",ch);
                  multi_hit(ch_00,ch,-1);
                  return;
                }
                obj_from_char(obj_00);
                obj_to_char(obj_00,ch);
                return;
              }
            }
            iVar4 = iVar4 + 1;
            ppOVar6 = &obj_00->next_content;
          }
        }
        ppCVar5 = &ch_00->next_in_room;
      }
    }
  }
  return;
}

Assistant:

void pulse_prog_steal(OBJ_DATA *obj, bool isTick)
{
	CHAR_DATA *vch, *ch = obj->carried_by;
	OBJ_DATA *stolen = nullptr;
	bool dbreak= false;
	int invnum = number_range(0, 5), i = 0;

	if (!ch || !is_worn(obj) || ch->position != POS_STANDING)
		return;

	for (vch = ch->in_room->people; vch != nullptr; vch = vch->next_in_room)
	{
		if (number_percent() < 98 || vch == ch)
			continue;

		for (stolen = vch->carrying; stolen != nullptr; stolen = stolen->next_content)
		{
			if (stolen->wear_loc == WEAR_NONE && (can_see_obj(ch, stolen)) && (invnum == i || !stolen->next_content))
			{
				dbreak = true;
				break;
			}

			i++;
		}

		if (dbreak)
			break;
	}

	if (!stolen || !vch)
		return;

	send_to_char("You grin evilly as a sudden urge takes hold of you.\n\r", ch);
	act("Slipping into $N's pockets, you carefully slide $p out.", ch, stolen, vch, TO_CHAR);

	if (number_percent() > 95 && vch->position != POS_SLEEPING)
	{
		do_myell(vch, "Keep your hands out of there!", ch);
		send_to_char("Oops.\n\r", ch);
		multi_hit(vch, ch, TYPE_UNDEFINED);
		return;
	}

	obj_from_char(stolen);
	obj_to_char(stolen, ch);
}